

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

char * __thiscall
adios2::format::BP5Serializer::BuildVarName
          (BP5Serializer *this,char *base_name,ShapeID Shape,int type,int element_size)

{
  size_t sVar1;
  char *__s;
  char *pcVar2;
  
  if (Shape < (LocalValue|GlobalArray)) {
    pcVar2 = (&PTR_anon_var_dwarf_13a608f_00884ea0)[Shape];
  }
  else {
    pcVar2 = "BP5";
  }
  sVar1 = strlen(base_name);
  __s = (char *)malloc(sVar1 + 0x15);
  if (element_size == 0) {
    *(undefined4 *)__s = *(undefined4 *)pcVar2;
    sVar1 = strlen(__s);
    (__s + sVar1)[0] = '_';
    (__s + sVar1)[1] = '\0';
  }
  else {
    snprintf(__s,sVar1 + 0x15,"%s_%d_%d_",pcVar2,(ulong)(uint)element_size,(ulong)(uint)type);
  }
  pcVar2 = strcat(__s,base_name);
  return pcVar2;
}

Assistant:

char *BP5Serializer::BuildVarName(const char *base_name, const ShapeID Shape, const int type,
                                  const int element_size)
{

    const char *Prefix = NamePrefix(Shape);
    auto Len = strlen(base_name) + 2 + strlen(Prefix) + 16;
    char *Ret = (char *)malloc(Len);
    if (element_size == 0)
    {
        strcpy(Ret, Prefix);
        strcat(Ret, "_");
        strcat(Ret, base_name);
    }
    else
    {
        snprintf(Ret, Len, "%s_%d_%d_", Prefix, element_size, type);
        strcat(Ret, base_name);
    }
    return Ret;
}